

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::initFactorMatrix(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         **vec,
                  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *eps)

{
  U *pUVar1;
  Col *pCVar2;
  Dring *pDVar3;
  Dring *pDVar4;
  undefined8 *puVar5;
  uint *puVar6;
  bool bVar7;
  uint uVar8;
  fpclass_type fVar9;
  int32_t iVar10;
  int *piVar11;
  int *piVar12;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar13;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar14;
  pointer pnVar15;
  undefined8 uVar16;
  byte bVar17;
  int iVar18;
  long_long_type lVar19;
  ulong uVar20;
  byte bVar21;
  int iVar22;
  long lVar23;
  Dring *pDVar24;
  int iVar25;
  long lVar26;
  long lVar27;
  Dring *pDVar28;
  long lVar29;
  Dring *pDVar30;
  ulong i;
  Dring *pDVar31;
  cpp_dec_float<100U,_int,_void> vv;
  int local_368;
  cpp_dec_float<100U,_int,_void> local_348;
  uint local_2f8 [18];
  long local_2b0;
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  uint local_278 [3];
  undefined3 uStack_26b;
  int iStack_268;
  bool bStack_264;
  undefined8 local_260;
  uint *local_258;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  **local_250;
  cpp_dec_float<100U,_int,_void> *local_248;
  int *local_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 uStack_218;
  uint uStack_210;
  uint local_20c;
  uint uStack_208;
  uint auStack_204 [3];
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  uint auStack_1c0 [2];
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  uint auStack_180 [2];
  cpp_dec_float<100U,_int,_void> local_178;
  cpp_dec_float<100U,_int,_void> local_128;
  cpp_dec_float<100U,_int,_void> local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_80;
  
  local_2f8[0xc] = 0;
  local_2f8[0xd] = 0;
  local_2f8[0xe] = 0;
  local_2f8[8] = 0;
  local_2f8[9] = 0;
  local_2f8[10] = 0;
  local_2f8[0xb] = 0;
  local_2f8[4] = 0;
  local_2f8[5] = 0;
  local_2f8[6] = 0;
  local_2f8[7] = 0;
  local_2f8[0] = 0;
  local_2f8[1] = 0;
  local_2f8[2] = 0;
  local_2f8[3] = 0;
  local_240 = (this->temp).s_mark;
  i = 0;
  if (0 < this->thedim) {
    piVar11 = (this->u).row.len;
    piVar12 = (this->u).row.max;
    lVar26 = 0;
    do {
      piVar11[lVar26] = 0;
      piVar12[lVar26] = 0;
      lVar26 = lVar26 + 1;
      uVar20 = (ulong)this->thedim;
    } while (lVar26 < (long)uVar20);
    i = 0;
    if (0 < this->thedim) {
      piVar11 = (this->u).row.max;
      lVar26 = 0;
      do {
        iVar25 = vec[lVar26]->memused;
        if ((long)iVar25 < 2) {
          if (iVar25 == 0) goto LAB_003e06f3;
        }
        else {
          pNVar13 = vec[lVar26]->m_elem;
          lVar27 = 0;
          do {
            piVar12 = piVar11 + *(int *)((long)(&pNVar13->val + 1) + lVar27);
            *piVar12 = *piVar12 + 1;
            lVar27 = lVar27 + 0x54;
          } while ((long)iVar25 * 0x54 - lVar27 != 0);
          uVar20 = (ulong)(uint)this->thedim;
          i = (ulong)(uint)(iVar25 + (int)i);
        }
        lVar26 = lVar26 + 1;
      } while (lVar26 < (int)uVar20);
      i = (ulong)(int)i;
    }
  }
  local_260._0_4_ = cpp_dec_float_finite;
  local_260._4_4_ = 0x10;
  local_2a8 = (undefined1  [16])0x0;
  local_298 = (undefined1  [16])0x0;
  local_288 = (undefined1  [16])0x0;
  local_278[0] = 0;
  local_278[1] = 0;
  stack0xfffffffffffffd90 = 0;
  uStack_26b = 0;
  iStack_268 = 0;
  bStack_264 = false;
  local_250 = vec;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (&local_348,i,(type *)0x0);
  if ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
       *)local_2a8 != &this->rowMemMult) {
    local_2a8 = *(undefined1 (*) [16])(this->rowMemMult).m_backend.data._M_elems;
    local_298 = *(undefined1 (*) [16])((this->rowMemMult).m_backend.data._M_elems + 4);
    local_288 = *(undefined1 (*) [16])((this->rowMemMult).m_backend.data._M_elems + 8);
    local_278._0_8_ = *(undefined8 *)((this->rowMemMult).m_backend.data._M_elems + 0xc);
    uVar16 = *(undefined8 *)((this->rowMemMult).m_backend.data._M_elems + 0xe);
    stack0xfffffffffffffd90 = (undefined5)uVar16;
    uStack_26b = (undefined3)((ulong)uVar16 >> 0x28);
    iStack_268 = (this->rowMemMult).m_backend.exp;
    bStack_264 = (this->rowMemMult).m_backend.neg;
    local_260._0_4_ = (this->rowMemMult).m_backend.fpclass;
    local_260._4_4_ = (this->rowMemMult).m_backend.prec_elem;
  }
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
            ((cpp_dec_float<100U,_int,_void> *)local_2a8,&local_348);
  lVar26 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::extract_signed_long_long
                     ((cpp_dec_float<100U,_int,_void> *)local_2a8);
  if (lVar26 < -0x7fffffff) {
    lVar26 = -0x80000000;
  }
  if (0x7ffffffe < lVar26) {
    lVar26 = 0x7fffffff;
  }
  minRowMem(this,(int)lVar26);
  local_260._0_4_ = cpp_dec_float_finite;
  local_260._4_4_ = 0x10;
  local_2a8 = (undefined1  [16])0x0;
  local_298 = (undefined1  [16])0x0;
  local_288 = (undefined1  [16])0x0;
  local_278[0] = 0;
  local_278[1] = 0;
  stack0xfffffffffffffd90 = 0;
  uStack_26b = 0;
  iStack_268 = 0;
  bStack_264 = false;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (&local_348,i,(type *)0x0);
  if ((cpp_dec_float<100U,_int,_void> *)local_2a8 != &(this->colMemMult).m_backend) {
    local_2a8 = *(undefined1 (*) [16])(this->colMemMult).m_backend.data._M_elems;
    local_298 = *(undefined1 (*) [16])((this->colMemMult).m_backend.data._M_elems + 4);
    local_288 = *(undefined1 (*) [16])((this->colMemMult).m_backend.data._M_elems + 8);
    local_278._0_8_ = *(undefined8 *)((this->colMemMult).m_backend.data._M_elems + 0xc);
    uVar16 = *(undefined8 *)((this->colMemMult).m_backend.data._M_elems + 0xe);
    stack0xfffffffffffffd90 = (undefined5)uVar16;
    uStack_26b = (undefined3)((ulong)uVar16 >> 0x28);
    iStack_268 = (this->colMemMult).m_backend.exp;
    bStack_264 = (this->colMemMult).m_backend.neg;
    local_260._0_4_ = (this->colMemMult).m_backend.fpclass;
    local_260._4_4_ = (this->colMemMult).m_backend.prec_elem;
  }
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
            ((cpp_dec_float<100U,_int,_void> *)local_2a8,&local_348);
  lVar19 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::extract_signed_long_long
                     ((cpp_dec_float<100U,_int,_void> *)local_2a8);
  lVar26 = -0x80000000;
  if (-0x80000000 < lVar19) {
    lVar26 = lVar19;
  }
  if (0x7ffffffe < lVar26) {
    lVar26 = 0x7fffffff;
  }
  iVar25 = (int)lVar26;
  if ((this->u).col.size < iVar25) {
    (this->u).col.size = iVar25;
    spx_realloc<int*>(&(this->u).col.idx,iVar25);
  }
  local_260._0_4_ = cpp_dec_float_finite;
  local_260._4_4_ = 0x10;
  local_2a8 = (undefined1  [16])0x0;
  local_298 = (undefined1  [16])0x0;
  local_288 = (undefined1  [16])0x0;
  local_278[0] = 0;
  local_278[1] = 0;
  stack0xfffffffffffffd90 = 0;
  uStack_26b = 0;
  iStack_268 = 0;
  bStack_264 = false;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (&local_348,i,(type *)0x0);
  if ((cpp_dec_float<100U,_int,_void> *)local_2a8 != &(this->lMemMult).m_backend) {
    local_2a8 = *(undefined1 (*) [16])(this->lMemMult).m_backend.data._M_elems;
    local_298 = *(undefined1 (*) [16])((this->lMemMult).m_backend.data._M_elems + 4);
    local_288 = *(undefined1 (*) [16])((this->lMemMult).m_backend.data._M_elems + 8);
    local_278._0_8_ = *(undefined8 *)((this->lMemMult).m_backend.data._M_elems + 0xc);
    uVar16 = *(undefined8 *)((this->lMemMult).m_backend.data._M_elems + 0xe);
    stack0xfffffffffffffd90 = (undefined5)uVar16;
    uStack_26b = (undefined3)((ulong)uVar16 >> 0x28);
    iStack_268 = (this->lMemMult).m_backend.exp;
    bStack_264 = (this->lMemMult).m_backend.neg;
    local_260._0_4_ = (this->lMemMult).m_backend.fpclass;
    local_260._4_4_ = (this->lMemMult).m_backend.prec_elem;
  }
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
            ((cpp_dec_float<100U,_int,_void> *)local_2a8,&local_348);
  lVar19 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::extract_signed_long_long
                     ((cpp_dec_float<100U,_int,_void> *)local_2a8);
  lVar26 = -0x80000000;
  if (-0x80000000 < lVar19) {
    lVar26 = lVar19;
  }
  if (0x7ffffffe < lVar26) {
    lVar26 = 0x7fffffff;
  }
  minLMem(this,(int)lVar26);
  pUVar1 = &this->u;
  piVar11 = (this->u).row.start;
  *piVar11 = 0;
  pDVar24 = (this->u).row.elem;
  piVar12 = (this->u).row.max;
  iVar25 = this->thedim;
  lVar26 = (long)iVar25;
  pCVar2 = &(this->u).col;
  (this->u).row.list.idx = iVar25;
  (this->u).row.list.next = pDVar24;
  pDVar28 = (this->u).col.elem;
  (this->u).col.list.idx = iVar25;
  (this->u).col.list.next = pDVar28;
  if (lVar26 < 1) {
    iVar25 = 0;
    pDVar24 = (Dring *)pUVar1;
    pDVar28 = &pCVar2->list;
  }
  else {
    lVar23 = 0;
    iVar25 = 0;
    lVar27 = 0;
    pDVar30 = (Dring *)pUVar1;
    pDVar31 = &pCVar2->list;
    do {
      lVar29 = lVar27;
      pDVar3 = (Dring *)((long)&pDVar24->next + lVar29);
      pDVar4 = (Dring *)((long)&pDVar28->next + lVar29);
      piVar11[lVar23] = iVar25;
      iVar25 = iVar25 + piVar12[lVar23];
      *(int *)((long)&pDVar24->idx + lVar29) = (int)lVar23;
      *(Dring **)((long)&pDVar24->prev + lVar29) = pDVar30;
      (((Row *)&pDVar30->next)->list).next = pDVar3;
      *(int *)((long)&pDVar28->idx + lVar29) = (int)lVar23;
      *(Dring **)((long)&pDVar28->prev + lVar29) = pDVar31;
      ((Dring *)&pDVar31->next)->next = pDVar4;
      lVar23 = lVar23 + 1;
      lVar26 = (long)this->thedim;
      lVar27 = lVar29 + 0x18;
      pDVar30 = pDVar3;
      pDVar31 = pDVar4;
    } while (lVar23 < lVar26);
    pDVar24 = (Dring *)((long)&pDVar24->next + lVar29);
    pDVar28 = (Dring *)((long)&pDVar28->next + lVar29);
  }
  piVar11[lVar26] = 0;
  piVar12[this->thedim] = 0;
  (this->u).row.used = iVar25;
  (((Row *)&pDVar24->next)->list).next = (Dring *)pUVar1;
  (this->u).row.list.prev = pDVar24;
  ((Dring *)&pDVar28->next)->next = &pCVar2->list;
  (this->u).col.list.prev = pDVar28;
  (this->temp).stage = 0;
  local_248 = &(this->initMaxabs).m_backend;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=(local_248,0);
  iVar25 = 0;
  if (0 < this->thedim) {
    local_258 = (this->initMaxabs).m_backend.data._M_elems + 1;
    local_2b0 = 0;
    iVar25 = 0;
    do {
      pSVar14 = local_250[local_2b0];
      (this->u).col.start[local_2b0] = iVar25;
      if (pSVar14->memused < 1) {
LAB_003e06f3:
        this->stat = SINGULAR;
        return;
      }
      iVar22 = 0;
      lVar26 = 0x48;
      lVar27 = 1;
      do {
        pNVar13 = pSVar14->m_elem;
        puVar5 = (undefined8 *)((long)(pNVar13->val).m_backend.data._M_elems + lVar26 + -0x48);
        local_1b8 = *puVar5;
        uStack_1b0 = puVar5[1];
        puVar5 = (undefined8 *)((long)(pNVar13->val).m_backend.data._M_elems + lVar26 + -0x38);
        local_1a8 = *puVar5;
        uStack_1a0 = puVar5[1];
        puVar5 = (undefined8 *)((long)(pNVar13->val).m_backend.data._M_elems + lVar26 + -0x28);
        local_198 = *puVar5;
        uStack_190 = puVar5[1];
        puVar5 = (undefined8 *)((long)(pNVar13->val).m_backend.data._M_elems + lVar26 + -0x18);
        local_188 = *puVar5;
        local_348.data._M_elems._56_8_ = puVar5[1];
        local_348.exp = *(int *)((long)(pNVar13->val).m_backend.data._M_elems + lVar26 + -8);
        local_348.neg = *(bool *)((long)(pNVar13->val).m_backend.data._M_elems + lVar26 + -4);
        local_348._72_8_ = *(undefined8 *)((long)(pNVar13->val).m_backend.data._M_elems + lVar26);
        local_d8.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
        local_d8.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
        local_d8.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
        local_d8.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
        local_d8.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
        local_d8.data._M_elems._40_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 10);
        local_d8.data._M_elems._48_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
        local_d8.data._M_elems._56_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
        local_d8.exp = (eps->m_backend).exp;
        local_d8.neg = (eps->m_backend).neg;
        local_d8.fpclass = (eps->m_backend).fpclass;
        local_d8.prec_elem = (eps->m_backend).prec_elem;
        local_348.data._M_elems[0xc] = (uint)local_188;
        local_348.data._M_elems[0xd] = (uint)((ulong)local_188 >> 0x20);
        local_348.data._M_elems[8] = (uint)local_198;
        local_348.data._M_elems[9] = (uint)((ulong)local_198 >> 0x20);
        local_348.data._M_elems[10] = (uint)uStack_190;
        local_348.data._M_elems[0xb] = (uint)((ulong)uStack_190 >> 0x20);
        local_348.data._M_elems[4] = (uint)local_1a8;
        local_348.data._M_elems[5] = (uint)((ulong)local_1a8 >> 0x20);
        local_348.data._M_elems[6] = (uint)uStack_1a0;
        local_348.data._M_elems[7] = (uint)((ulong)uStack_1a0 >> 0x20);
        local_348.data._M_elems[0] = (uint)local_1b8;
        local_348.data._M_elems[1] = (uint)((ulong)local_1b8 >> 0x20);
        local_348.data._M_elems[2] = (uint)uStack_1b0;
        local_348.data._M_elems[3] = (uint)((ulong)uStack_1b0 >> 0x20);
        if ((local_348.neg == true) &&
           (local_348.data._M_elems[0] != 0 || local_348.fpclass != cpp_dec_float_finite)) {
          local_348.neg = false;
        }
        auStack_180 = (uint  [2])local_348.data._M_elems._56_8_;
        if (local_d8.fpclass != cpp_dec_float_NaN && local_348.fpclass != cpp_dec_float_NaN) {
          iVar18 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (&local_348,&local_d8);
          iVar22 = iVar22 + (uint)(0 < iVar18);
        }
        if (pSVar14->memused <= lVar27) break;
        lVar26 = lVar26 + 0x54;
        lVar27 = lVar27 + 1;
      } while (iVar22 < 2);
      if (iVar22 == 1) {
        lVar26 = 0;
        do {
          lVar27 = lVar26;
          pNVar13 = pSVar14->m_elem;
          puVar5 = (undefined8 *)((long)(pNVar13->val).m_backend.data._M_elems + lVar27);
          local_1f8 = *puVar5;
          uStack_1f0 = puVar5[1];
          puVar5 = (undefined8 *)((long)(pNVar13->val).m_backend.data._M_elems + lVar27 + 0x10);
          local_1e8 = *puVar5;
          uStack_1e0 = puVar5[1];
          puVar5 = (undefined8 *)((long)(pNVar13->val).m_backend.data._M_elems + lVar27 + 0x20);
          local_1d8 = *puVar5;
          uStack_1d0 = puVar5[1];
          puVar5 = (undefined8 *)((long)(pNVar13->val).m_backend.data._M_elems + lVar27 + 0x30);
          local_1c8 = *puVar5;
          local_348.data._M_elems._56_8_ = puVar5[1];
          local_348.exp = *(int *)((long)(&(pNVar13->val).m_backend.data + 1) + lVar27);
          local_348.neg = *(bool *)((long)(&(pNVar13->val).m_backend.data + 1) + lVar27 + 4);
          local_348._72_8_ =
               *(undefined8 *)((long)(&(pNVar13->val).m_backend.data + 1) + lVar27 + 8);
          local_128.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
          local_128.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
          local_128.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
          local_128.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
          local_128.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
          local_128.data._M_elems._40_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 10);
          local_128.data._M_elems._48_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
          local_128.data._M_elems._56_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
          local_128.exp = (eps->m_backend).exp;
          local_128.neg = (eps->m_backend).neg;
          local_128.fpclass = (eps->m_backend).fpclass;
          local_128.prec_elem = (eps->m_backend).prec_elem;
          local_348.data._M_elems[0xc] = (uint)local_1c8;
          local_348.data._M_elems[0xd] = (uint)((ulong)local_1c8 >> 0x20);
          local_348.data._M_elems[8] = (uint)local_1d8;
          local_348.data._M_elems[9] = (uint)((ulong)local_1d8 >> 0x20);
          local_348.data._M_elems[10] = (uint)uStack_1d0;
          local_348.data._M_elems[0xb] = (uint)((ulong)uStack_1d0 >> 0x20);
          local_348.data._M_elems[4] = (uint)local_1e8;
          local_348.data._M_elems[5] = (uint)((ulong)local_1e8 >> 0x20);
          local_348.data._M_elems[6] = (uint)uStack_1e0;
          local_348.data._M_elems[7] = (uint)((ulong)uStack_1e0 >> 0x20);
          local_348.data._M_elems[0] = (uint)local_1f8;
          local_348.data._M_elems[1] = (uint)((ulong)local_1f8 >> 0x20);
          local_348.data._M_elems[2] = (uint)uStack_1f0;
          local_348.data._M_elems[3] = (uint)((ulong)uStack_1f0 >> 0x20);
          if ((local_348.neg == true) &&
             (local_348.data._M_elems[0] != 0 || local_348.fpclass != cpp_dec_float_finite)) {
            local_348.neg = false;
          }
          auStack_1c0 = (uint  [2])local_348.data._M_elems._56_8_;
          if ((local_348.fpclass == cpp_dec_float_NaN) || (local_128.fpclass == cpp_dec_float_NaN))
          break;
          iVar22 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (&local_348,&local_128);
          lVar26 = lVar27 + 0x54;
        } while (iVar22 < 1);
        pNVar13 = pSVar14->m_elem;
        if (-1 < (this->row).perm[*(int *)((long)(&pNVar13->val + 1) + lVar27)]) goto LAB_003e06f3;
        uVar8 = *(uint *)((long)(pNVar13->val).m_backend.data._M_elems + lVar27);
        puVar5 = (undefined8 *)((long)(pNVar13->val).m_backend.data._M_elems + lVar27 + 0x30);
        local_348.data._M_elems._56_8_ = puVar5[1];
        local_2f8[0xc] = (uint)((ulong)*puVar5 >> 0x20);
        puVar6 = (uint *)((long)(pNVar13->val).m_backend.data._M_elems + lVar27 + 0x24);
        local_2f8._32_8_ = *(undefined8 *)puVar6;
        uVar16 = *(undefined8 *)(puVar6 + 2);
        local_2f8[10] = (uint)uVar16;
        local_2f8[0xb] = (uint)((ulong)uVar16 >> 0x20);
        puVar6 = (uint *)((long)(pNVar13->val).m_backend.data._M_elems + lVar27 + 0x14);
        local_2f8._16_8_ = *(undefined8 *)puVar6;
        local_2f8._24_8_ = *(undefined8 *)(puVar6 + 2);
        puVar6 = (uint *)((long)(pNVar13->val).m_backend.data._M_elems + lVar27 + 4);
        local_2f8._0_8_ = *(undefined8 *)puVar6;
        local_2f8._8_8_ = *(undefined8 *)(puVar6 + 2);
        iVar22 = *(int *)((long)(&(pNVar13->val).m_backend.data + 1) + lVar27);
        bVar21 = *(byte *)((long)(&(pNVar13->val).m_backend.data + 1) + lVar27 + 4);
        fVar9 = *(fpclass_type *)((long)(&(pNVar13->val).m_backend.data + 1) + lVar27 + 8);
        iVar10 = *(int32_t *)((long)(&(pNVar13->val).m_backend.data + 1) + lVar27 + 0xc);
        local_348.data._M_elems[0xd] = local_2f8[0xc];
        local_348.data._M_elems[9] = (uint)local_2f8._32_8_;
        local_348.data._M_elems[10] = SUB84(local_2f8._32_8_,4);
        local_348.data._M_elems[5] = (uint)local_2f8._16_8_;
        local_348.data._M_elems[6] = SUB84(local_2f8._16_8_,4);
        local_348.data._M_elems[7] = (uint)local_2f8._24_8_;
        local_348.data._M_elems[8] = SUB84(local_2f8._24_8_,4);
        local_348.data._M_elems[1] = (uint)local_2f8._0_8_;
        local_348.data._M_elems[2] = SUB84(local_2f8._0_8_,4);
        local_348.data._M_elems[3] = (uint)local_2f8._8_8_;
        local_348.data._M_elems[4] = SUB84(local_2f8._8_8_,4);
        local_348.prec_elem = iVar10;
        local_348.fpclass = fVar9;
        local_348.neg = (bool)bVar21;
        if ((bVar21 == 1) && (fVar9 != cpp_dec_float_finite || uVar8 != 0)) {
          local_348.neg = false;
        }
        local_348.data._M_elems[0] = uVar8;
        local_348.data._M_elems[0xb] = local_2f8[10];
        local_348.data._M_elems[0xc] = local_2f8[0xb];
        local_348.exp = iVar22;
        local_2f8._52_8_ = local_348.data._M_elems._56_8_;
        if (((fVar9 != cpp_dec_float_NaN) &&
            ((this->initMaxabs).m_backend.fpclass != cpp_dec_float_NaN)) &&
           (iVar18 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               (&local_348,local_248), 0 < iVar18)) {
          bVar17 = bVar21;
          if (bVar21 != 0) {
            bVar17 = (fVar9 != cpp_dec_float_finite || uVar8 != 0) ^ bVar21;
          }
          (this->initMaxabs).m_backend.data._M_elems[0] = uVar8;
          *(ulong *)(local_258 + 0xb) = CONCAT44(local_2f8[0xc],local_2f8[0xb]);
          *(undefined8 *)(local_258 + 0xd) = local_2f8._52_8_;
          *(undefined8 *)(local_258 + 8) = local_2f8._32_8_;
          *(ulong *)(local_258 + 10) = CONCAT44(local_2f8[0xb],local_2f8[10]);
          *(undefined8 *)(local_258 + 4) = local_2f8._16_8_;
          *(undefined8 *)(local_258 + 6) = local_2f8._24_8_;
          *(undefined8 *)local_258 = local_2f8._0_8_;
          *(undefined8 *)(local_258 + 2) = local_2f8._8_8_;
          (this->initMaxabs).m_backend.exp = iVar22;
          (this->initMaxabs).m_backend.neg = (bool)bVar17;
          (this->initMaxabs).m_backend.fpclass = fVar9;
          (this->initMaxabs).m_backend.prec_elem = iVar10;
        }
        local_80.m_backend.data._M_elems[0xd] = local_2f8[0xc];
        local_80.m_backend.data._M_elems[0xe] = local_2f8[0xd];
        local_80.m_backend.data._M_elems[0xf] = local_2f8[0xe];
        local_80.m_backend.data._M_elems[9] = local_2f8[8];
        local_80.m_backend.data._M_elems[10] = local_2f8[9];
        local_80.m_backend.data._M_elems[0xb] = local_2f8[10];
        local_80.m_backend.data._M_elems[0xc] = local_2f8[0xb];
        local_80.m_backend.data._M_elems[5] = local_2f8[4];
        local_80.m_backend.data._M_elems[6] = local_2f8[5];
        local_80.m_backend.data._M_elems[7] = local_2f8[6];
        local_80.m_backend.data._M_elems[8] = local_2f8[7];
        local_80.m_backend.data._M_elems[1] = local_2f8[0];
        local_80.m_backend.data._M_elems[2] = local_2f8[1];
        local_80.m_backend.data._M_elems[3] = local_2f8[2];
        local_80.m_backend.data._M_elems[4] = local_2f8[3];
        iVar18 = (int)local_2b0;
        local_80.m_backend.data._M_elems[0] = uVar8;
        local_80.m_backend.exp = iVar22;
        local_80.m_backend.neg = (bool)bVar21;
        local_80.m_backend.fpclass = fVar9;
        local_80.m_backend.prec_elem = iVar10;
        setPivot(this,(this->temp).stage,iVar18,*(int *)((long)(&pSVar14->m_elem->val + 1) + lVar27)
                 ,&local_80);
        local_240[(this->temp).stage] = iVar18;
        piVar11 = &(this->temp).stage;
        *piVar11 = *piVar11 + 1;
LAB_003e0697:
        local_368 = 0;
      }
      else {
        if (iVar22 == 0) goto LAB_003e06f3;
        if (pSVar14->memused < 1) goto LAB_003e0697;
        lVar27 = 0;
        lVar26 = 0;
        local_368 = 0;
        do {
          pNVar13 = pSVar14->m_elem;
          uVar8 = *(uint *)((long)(pNVar13->val).m_backend.data._M_elems + lVar27);
          puVar5 = (undefined8 *)((long)(pNVar13->val).m_backend.data._M_elems + lVar27 + 0x30);
          local_2f8._52_8_ = puVar5[1];
          local_2f8[0xc] = (uint)((ulong)*puVar5 >> 0x20);
          puVar6 = (uint *)((long)(pNVar13->val).m_backend.data._M_elems + lVar27 + 0x24);
          local_2f8._32_8_ = *(undefined8 *)puVar6;
          uVar16 = *(undefined8 *)(puVar6 + 2);
          local_2f8[10] = (uint)uVar16;
          local_2f8[0xb] = (uint)((ulong)uVar16 >> 0x20);
          puVar6 = (uint *)((long)(pNVar13->val).m_backend.data._M_elems + lVar27 + 0x14);
          local_2f8._16_8_ = *(undefined8 *)puVar6;
          local_2f8._24_8_ = *(undefined8 *)(puVar6 + 2);
          puVar6 = (uint *)((long)(pNVar13->val).m_backend.data._M_elems + lVar27 + 4);
          local_2f8._0_8_ = *(undefined8 *)puVar6;
          local_2f8._8_8_ = *(undefined8 *)(puVar6 + 2);
          iVar22 = *(int *)((long)(&(pNVar13->val).m_backend.data + 1) + lVar27);
          bVar7 = *(bool *)((long)(&(pNVar13->val).m_backend.data + 1) + lVar27 + 4);
          fVar9 = *(fpclass_type *)((long)(&(pNVar13->val).m_backend.data + 1) + lVar27 + 8);
          iVar10 = *(int32_t *)((long)(&(pNVar13->val).m_backend.data + 1) + lVar27 + 0xc);
          puVar5 = (undefined8 *)((long)(pNVar13->val).m_backend.data._M_elems + lVar27 + 4);
          local_238 = *puVar5;
          uStack_230 = puVar5[1];
          puVar5 = (undefined8 *)((long)(pNVar13->val).m_backend.data._M_elems + lVar27 + 0x14);
          local_228 = *puVar5;
          uStack_220 = puVar5[1];
          puVar5 = (undefined8 *)((long)(pNVar13->val).m_backend.data._M_elems + lVar27 + 0x24);
          uStack_218 = *puVar5;
          uVar16 = puVar5[1];
          puVar5 = (undefined8 *)((long)(pNVar13->val).m_backend.data._M_elems + lVar27 + 0x30);
          local_348.data._M_elems._56_8_ = puVar5[1];
          uStack_208 = (uint)((ulong)*puVar5 >> 0x20);
          uStack_210 = (uint)uVar16;
          local_20c = (uint)((ulong)uVar16 >> 0x20);
          local_178.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
          local_178.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
          local_178.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
          local_178.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
          local_178.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
          local_178.data._M_elems._40_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 10);
          local_178.data._M_elems._48_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
          local_178.data._M_elems._56_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
          local_178.exp = (eps->m_backend).exp;
          local_178.neg = (eps->m_backend).neg;
          local_178.fpclass = (eps->m_backend).fpclass;
          local_178.prec_elem = (eps->m_backend).prec_elem;
          local_348.data._M_elems[0xd] = uStack_208;
          local_348.data._M_elems[9] = (uint)uStack_218;
          local_348.data._M_elems[10] = (uint)((ulong)uStack_218 >> 0x20);
          local_348.data._M_elems[5] = (uint)local_228;
          local_348.data._M_elems[6] = (uint)((ulong)local_228 >> 0x20);
          local_348.data._M_elems[7] = (uint)uStack_220;
          local_348.data._M_elems[8] = (uint)((ulong)uStack_220 >> 0x20);
          local_348.data._M_elems[1] = (uint)local_238;
          local_348.data._M_elems[2] = (uint)((ulong)local_238 >> 0x20);
          local_348.data._M_elems[3] = (uint)uStack_230;
          local_348.data._M_elems[4] = (uint)((ulong)uStack_230 >> 0x20);
          local_348.prec_elem = iVar10;
          local_348.fpclass = fVar9;
          local_348.neg = bVar7;
          if ((bVar7 == true) && (fVar9 != cpp_dec_float_finite || uVar8 != 0)) {
            local_348.neg = false;
          }
          auStack_204._0_8_ = local_348.data._M_elems._56_8_;
          if ((local_178.fpclass != cpp_dec_float_NaN && fVar9 != cpp_dec_float_NaN) &&
             (local_348.data._M_elems[0] = uVar8, local_348.data._M_elems[0xb] = uStack_210,
             local_348.data._M_elems[0xc] = local_20c, local_348.exp = iVar22,
             iVar18 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                (&local_348,&local_178), 0 < iVar18)) {
            iVar18 = *(int *)((long)(&pSVar14->m_elem->val + 1) + lVar27);
            (this->u).col.idx[iVar25] = iVar18;
            lVar23 = (long)(this->u).row.len[iVar18] + (long)(this->u).row.start[iVar18];
            (this->u).row.idx[lVar23] = (int)local_2b0;
            pnVar15 = (this->u).row.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pnVar15[lVar23].m_backend.data._M_elems[0] = uVar8;
            puVar6 = (uint *)((long)pnVar15[lVar23].m_backend.data._M_elems + 4);
            *(undefined8 *)puVar6 = local_2f8._0_8_;
            *(undefined8 *)(puVar6 + 2) = local_2f8._8_8_;
            puVar6 = (uint *)((long)pnVar15[lVar23].m_backend.data._M_elems + 0x14);
            *(undefined8 *)puVar6 = local_2f8._16_8_;
            *(undefined8 *)(puVar6 + 2) = local_2f8._24_8_;
            puVar6 = (uint *)((long)pnVar15[lVar23].m_backend.data._M_elems + 0x24);
            *(undefined8 *)puVar6 = local_2f8._32_8_;
            *(ulong *)(puVar6 + 2) = CONCAT44(local_2f8[0xb],local_2f8[10]);
            puVar6 = (uint *)((long)pnVar15[lVar23].m_backend.data._M_elems + 0x30);
            *(ulong *)puVar6 = CONCAT44(local_2f8[0xc],local_2f8[0xb]);
            *(undefined8 *)(puVar6 + 2) = local_2f8._52_8_;
            pnVar15[lVar23].m_backend.exp = iVar22;
            pnVar15[lVar23].m_backend.neg = bVar7;
            pnVar15[lVar23].m_backend.fpclass = fVar9;
            pnVar15[lVar23].m_backend.prec_elem = iVar10;
            piVar11 = (this->u).row.len + iVar18;
            *piVar11 = *piVar11 + 1;
            local_348.data._M_elems[0xd] = local_2f8[0xc];
            local_348.data._M_elems[0xe] = local_2f8[0xd];
            local_348.data._M_elems[0xf] = local_2f8[0xe];
            local_348.data._M_elems[9] = (uint)local_2f8._32_8_;
            local_348.data._M_elems[10] = SUB84(local_2f8._32_8_,4);
            local_348.data._M_elems[0xb] = local_2f8[10];
            local_348.data._M_elems[0xc] = local_2f8[0xb];
            local_348.data._M_elems[5] = (uint)local_2f8._16_8_;
            local_348.data._M_elems[6] = SUB84(local_2f8._16_8_,4);
            local_348.data._M_elems[7] = (uint)local_2f8._24_8_;
            local_348.data._M_elems[8] = SUB84(local_2f8._24_8_,4);
            local_348.data._M_elems[1] = (uint)local_2f8._0_8_;
            local_348.data._M_elems[2] = SUB84(local_2f8._0_8_,4);
            local_348.data._M_elems[3] = (uint)local_2f8._8_8_;
            local_348.data._M_elems[4] = SUB84(local_2f8._8_8_,4);
            local_348.neg = bVar7;
            if ((bVar7 != false) && (fVar9 != cpp_dec_float_finite || uVar8 != 0)) {
              local_348.neg = (bool)(bVar7 ^ 1);
            }
            if (((this->initMaxabs).m_backend.fpclass != cpp_dec_float_NaN) &&
               (local_348.data._M_elems[0] = uVar8, local_348.exp = iVar22,
               iVar18 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                  (&local_348,local_248), 0 < iVar18)) {
              if (bVar7 == false) {
                bVar21 = false;
              }
              else {
                bVar21 = bVar7 ^ (fVar9 != cpp_dec_float_finite || uVar8 != 0);
              }
              (this->initMaxabs).m_backend.data._M_elems[0] = uVar8;
              *(ulong *)(local_258 + 0xb) = CONCAT44(local_2f8[0xc],local_2f8[0xb]);
              *(undefined8 *)(local_258 + 0xd) = local_2f8._52_8_;
              *(undefined8 *)(local_258 + 8) = local_2f8._32_8_;
              *(ulong *)(local_258 + 10) = CONCAT44(local_2f8[0xb],local_2f8[10]);
              *(undefined8 *)(local_258 + 4) = local_2f8._16_8_;
              *(undefined8 *)(local_258 + 6) = local_2f8._24_8_;
              *(undefined8 *)local_258 = local_2f8._0_8_;
              *(undefined8 *)(local_258 + 2) = local_2f8._8_8_;
              (this->initMaxabs).m_backend.exp = iVar22;
              (this->initMaxabs).m_backend.neg = (bool)bVar21;
              (this->initMaxabs).m_backend.fpclass = fVar9;
              (this->initMaxabs).m_backend.prec_elem = iVar10;
            }
            iVar25 = iVar25 + 1;
            local_368 = local_368 + 1;
          }
          lVar26 = lVar26 + 1;
          lVar27 = lVar27 + 0x54;
        } while (lVar26 < pSVar14->memused);
      }
      (this->u).col.max[local_2b0] = local_368;
      (this->u).col.len[local_2b0] = local_368;
      (this->temp).s_cact[local_2b0] = local_368;
      local_2b0 = local_2b0 + 1;
    } while (local_2b0 < this->thedim);
  }
  (this->u).col.used = iVar25;
  return;
}

Assistant:

void CLUFactor<R>::initFactorMatrix(const SVectorBase<R>** vec, const R eps)
{

   R x;
   int m;
   int tot;
   Dring* rring, *lastrring;
   Dring* cring, *lastcring;
   const SVectorBase<R>* psv;
   int* sing = temp.s_mark;

   /*  Initialize:
    *  - column file thereby remembering column singletons in |sing|.
    *  - nonzeros counts per row
    *  - total number of nonzeros
    */

   for(int i = 0; i < thedim; i++)
      u.row.max[i] = u.row.len[i] = 0;

   tot = 0;

   for(int i = 0; i < thedim; i++)
   {
      int k;

      psv = vec[i];
      k = psv->size();

      if(k > 1)
      {
         tot += k;

         for(int j = 0; j < k; ++j)
            u.row.max[psv->index(j)]++;
      }
      else if(k == 0)
      {
         this->stat = SLinSolver<R>::SINGULAR;
         return;
      }
   }

   /*  Resize nonzero memory if necessary
    */
   minRowMem(int(rowMemMult * tot));

   minColMem(int(colMemMult * tot));

   minLMem(int(lMemMult * tot));


   /*  Initialize:
    *  - row ring lists
    *  - row vectors in file
    *  - column ring lists
    */
   u.row.start[0] = 0;

   rring = u.row.elem;

   lastrring = &(u.row.list);

   lastrring->idx = thedim;

   lastrring->next = rring;

   cring = u.col.elem;

   lastcring = &(u.col.list);

   lastcring->idx = thedim;

   lastcring->next = cring;

   m = 0;

   for(int i = 0; i < thedim; i++)
   {
      u.row.start[i] = m;
      m += u.row.max[i];

      rring->idx = i;
      rring->prev = lastrring;
      lastrring->next = rring;
      lastrring = rring;
      ++rring;

      cring->idx = i;
      cring->prev = lastcring;
      lastcring->next = cring;
      lastcring = cring;
      ++cring;
   }

   u.row.start[thedim]       = 0;

   u.row.max[thedim]       = 0;
   u.row.used = m;

   lastrring->next = &(u.row.list);
   lastrring->next->prev = lastrring;

   lastcring->next = &(u.col.list);
   lastcring->next->prev = lastcring;

   /*  Copy matrix to row and column file
    *  excluding and marking column singletons!
    */
   m = 0;
   temp.stage = 0;

   initMaxabs = 0;

   for(int i = 0; i < thedim; i++)
   {
      int nnonzeros;

      psv = vec[i];
      u.col.start[i] = m;

      /* check whether number of nonzeros above tolerance is 0, 1 or >= 2 */
      nnonzeros = 0;

      for(int j = 0; j < psv->size() && nnonzeros <= 1; j++)
      {
         if(isNotZero(psv->value(j), eps))
            nnonzeros++;
      }

      /* basis is singular due to empty column */
      if(nnonzeros == 0)
      {
         this->stat = SLinSolver<R>::SINGULAR;
         return;
      }

      /* exclude column singletons */
      else if(nnonzeros == 1)
      {
         int j = 0;

         /* find nonzero */

         for(j = 0; isZero(psv->value(j), eps); j++)
            ;

         assert(j < psv->size());

         /* basis is singular due to two linearly dependent column singletons */
         if(row.perm[psv->index(j)] >= 0)
         {
            this->stat = SLinSolver<R>::SINGULAR;
            return;
         }

         /* update maximum absolute nonzero value */
         x = psv->value(j);

         if(spxAbs(x) > initMaxabs)
            initMaxabs = spxAbs(x);

         /* permute to front and mark as singleton */
         setPivot(temp.stage, i, psv->index(j), x);

         sing[temp.stage] = i;

         temp.stage++;

         /* set column length to zero */
         temp.s_cact[i] = u.col.len[i] = u.col.max[i] = 0;
      }

      /* add to active matrix if not a column singleton */
      else
      {
         int end;
         int k;

         /* go through all nonzeros in column */
         assert(nnonzeros >= 2);
         nnonzeros = 0;

         for(int j = 0; j < psv->size(); j++)
         {
            x = psv->value(j);

            if(isNotZero(x, eps))
            {
               /* add to column array */
               k = psv->index(j);
               u.col.idx[m] = k;
               m++;

               /* add to row array */
               end = u.row.start[k] + u.row.len[k];
               u.row.idx[end] = i;
               u.row.val[end] = x;
               u.row.len[k]++;

               /* update maximum absolute nonzero value */

               if(spxAbs(x) > initMaxabs)
                  initMaxabs = spxAbs(x);

               nnonzeros++;
            }
         }

         assert(nnonzeros >= 2);

         /* set column length */
         temp.s_cact[i] = u.col.len[i] = u.col.max[i] = nnonzeros;
      }
   }

   u.col.used = m;
}